

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O0

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<11,_13,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  Matrix<float,_4,_4> *extraout_RDX;
  Matrix<float,_4,_4> *extraout_RDX_00;
  Matrix<float,_4,_4> *mat;
  Matrix<float,_4,_4> *mat_00;
  VecAccess<float,_4,_3> local_120;
  Matrix<float,_4,_4> local_108;
  Vector<float,_3> local_c8 [2];
  Matrix<float,_4,_4> local_b0;
  Vector<float,_3> local_70;
  Vector<float,_3> local_64;
  undefined1 local_58 [8];
  Type in0;
  InputType in1Type_local;
  InputType in0Type_local;
  ShaderEvalContext *evalCtx_local;
  
  in0.m_data.m_data[3].m_data[2] = (float)in1Type;
  in0.m_data.m_data[3].m_data[3] = (float)in0Type;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    getInputValue<2,13>((Mat4 *)local_58,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX)
    ;
    mat = extraout_RDX;
  }
  else {
    getInputValue<0,13>((Mat4 *)local_58,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX)
    ;
    mat = extraout_RDX_00;
  }
  increment<float,4,4>(&local_b0,(MatrixCaseUtils *)local_58,mat);
  MatrixCaseUtils::reduceToVec3((MatrixCaseUtils *)&local_70,&local_b0);
  increment<float,4,4>(&local_108,(MatrixCaseUtils *)local_58,mat_00);
  MatrixCaseUtils::reduceToVec3((MatrixCaseUtils *)local_c8,&local_108);
  tcu::operator+((tcu *)&local_64,&local_70,local_c8);
  tcu::Vector<float,_4>::xyz(&local_120,&evalCtx->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_120,&local_64);
  tcu::Matrix<float,_4,_4>::~Matrix(&local_108);
  tcu::Matrix<float,_4,_4>::~Matrix(&local_b0);
  tcu::Matrix<float,_4,_4>::~Matrix((Matrix<float,_4,_4> *)local_58);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(increment(in0)) + reduceToVec3(increment(in0));
	}